

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_TemplateCache::Run(void)

{
  TemplateString local_1f8;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  Template *local_b8;
  Template *tpl2;
  Template *tpl;
  string local_a0 [32];
  ctemplate local_80 [8];
  string filename_b;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string filename_a;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Test template 1",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Test template 2.",(allocator *)((long)&tpl + 7));
  ctemplate::StringToTemplateFile(local_80,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl + 7));
  ctemplate::TemplateString::TemplateString(&local_d8,(string *)local_28);
  tpl2 = (Template *)ctemplate::Template::GetTemplate(&local_d8,DO_NOT_STRIP);
  if (tpl2 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x516,
           "tpl = Template::GetTemplate(filename_a, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_f8,(string *)local_28);
    tpl2 = (Template *)ctemplate::Template::GetTemplate(&local_f8,DO_NOT_STRIP);
    if (tpl2 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl = Template::GetTemplate(filename_a, DO_NOT_STRIP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x516,"static void Test_Template_TemplateCache::Run()");
  }
  ctemplate::TemplateString::TemplateString(&local_118,(string *)local_80);
  local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_118,DO_NOT_STRIP);
  if (local_b8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x518,
           "tpl2 = Template::GetTemplate(filename_b, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_138,(string *)local_80);
    local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_138,DO_NOT_STRIP);
    if (local_b8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = Template::GetTemplate(filename_b, DO_NOT_STRIP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x518,"static void Test_Template_TemplateCache::Run()");
  }
  if (local_b8 == tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x519,"tpl2 != tpl");
    if (local_b8 != tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 != tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x519,"static void Test_Template_TemplateCache::Run()");
  }
  ctemplate::TemplateString::TemplateString(&local_158,(string *)local_28);
  local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_158,STRIP_BLANK_LINES);
  if (local_b8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x51a,
           "tpl2 = Template::GetTemplate(filename_a, STRIP_BLANK_LINES)");
    ctemplate::TemplateString::TemplateString(&local_178,(string *)local_28);
    local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_178,STRIP_BLANK_LINES);
    if (local_b8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = Template::GetTemplate(filename_a, STRIP_BLANK_LINES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x51a,"static void Test_Template_TemplateCache::Run()");
  }
  if (local_b8 == tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x51b,"tpl2 != tpl");
    if (local_b8 != tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 != tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x51b,"static void Test_Template_TemplateCache::Run()");
  }
  ctemplate::TemplateString::TemplateString(&local_198,(string *)local_80);
  local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_198,STRIP_BLANK_LINES);
  if (local_b8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x51c,
           "tpl2 = Template::GetTemplate(filename_b, STRIP_BLANK_LINES)");
    ctemplate::TemplateString::TemplateString(&local_1b8,(string *)local_80);
    local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_1b8,STRIP_BLANK_LINES);
    if (local_b8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = Template::GetTemplate(filename_b, STRIP_BLANK_LINES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x51c,"static void Test_Template_TemplateCache::Run()");
  }
  if (local_b8 == tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x51d,"tpl2 != tpl");
    if (local_b8 != tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 != tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x51d,"static void Test_Template_TemplateCache::Run()");
  }
  ctemplate::TemplateString::TemplateString(&local_1d8,(string *)local_28);
  local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_1d8,DO_NOT_STRIP);
  if (local_b8 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x51e,
           "tpl2 = Template::GetTemplate(filename_a, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_1f8,(string *)local_28);
    local_b8 = (Template *)ctemplate::Template::GetTemplate(&local_1f8,DO_NOT_STRIP);
    if (local_b8 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl2 = Template::GetTemplate(filename_a, DO_NOT_STRIP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x51e,"static void Test_Template_TemplateCache::Run()");
  }
  if (local_b8 != tpl2) {
    printf("ASSERT FAILED, line %d: %s\n",0x51f,"tpl2 == tpl");
    if (local_b8 == tpl2) {
      exit(1);
    }
    __assert_fail("tpl2 == tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x51f,"static void Test_Template_TemplateCache::Run()");
  }
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

TEST(Template, TemplateCache) {
  const string filename_a = StringToTemplateFile("Test template 1");
  const string filename_b = StringToTemplateFile("Test template 2.");

  Template *tpl, *tpl2;
  ASSERT(tpl = Template::GetTemplate(filename_a, DO_NOT_STRIP));

  ASSERT(tpl2 = Template::GetTemplate(filename_b, DO_NOT_STRIP));
  ASSERT(tpl2 != tpl);  // different filenames.
  ASSERT(tpl2 = Template::GetTemplate(filename_a, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl);  // different strip.
  ASSERT(tpl2 = Template::GetTemplate(filename_b, STRIP_BLANK_LINES));
  ASSERT(tpl2 != tpl);  // different filenames and strip.
  ASSERT(tpl2 = Template::GetTemplate(filename_a, DO_NOT_STRIP));
  ASSERT(tpl2 == tpl);  // same filename and strip.
}